

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_pwd.c
# Opt level: O1

err_t cmdPwdGen(cmd_pwd_t *pwd,char *cmdline)

{
  char **ppcVar1;
  bool_t bVar2;
  err_t eVar3;
  int iVar4;
  u32 uVar5;
  size_t sVar6;
  octet *poVar7;
  octet *poVar8;
  size_t pwd_len;
  err_t eVar9;
  char *pcVar10;
  ulong uVar11;
  octet *poVar12;
  octet *si;
  long lVar13;
  ulong threshold;
  bool bVar14;
  int argc;
  octet *local_88;
  octet *local_80;
  char **argv;
  octet *local_70;
  octet *local_68;
  octet *local_60;
  octet *local_58;
  size_t local_50;
  octet *local_48;
  octet *local_40;
  size_t local_38;
  
  bVar2 = strStartsWith(cmdline,"pass:");
  if (bVar2 == 0) {
    bVar2 = strStartsWith(cmdline,"env:");
    if (bVar2 == 0) {
      bVar2 = strStartsWith(cmdline,"share:");
      if (bVar2 == 0) {
        return 0x25b;
      }
      sVar6 = strLen("share:");
      argv = (char **)0x0;
      local_68 = (octet *)0x0;
      eVar3 = cmdArgCreate(&argc,&argv,cmdline + sVar6);
      if (eVar3 != 0) {
        return eVar3;
      }
      eVar3 = 0;
      if (argc == 0) {
        bVar14 = true;
        lVar13 = 0;
        uVar11 = 0;
        poVar7 = (octet *)0x0;
      }
      else {
        local_80 = (octet *)((ulong)local_80 & 0xffffffff00000000);
        local_88 = (octet *)0x0;
        uVar11 = 0;
        lVar13 = 0;
        do {
          bVar2 = strStartsWith(argv[lVar13],"-");
          if (bVar2 == 0) break;
          bVar2 = strStartsWith(argv[lVar13],"-t");
          pcVar10 = argv[lVar13];
          if (bVar2 == 0) {
            bVar2 = strStartsWith(pcVar10,"-l");
            pcVar10 = argv[lVar13];
            if (bVar2 != 0) {
              sVar6 = strLen("-l");
              if (local_88 == (octet *)0x0) {
                pcVar10 = pcVar10 + sVar6;
                bVar2 = decIsValid(pcVar10);
                eVar9 = 0x25b;
                if (((bVar2 == 0) || (sVar6 = decCLZ(pcVar10), sVar6 != 0)) ||
                   (sVar6 = strLen(pcVar10), sVar6 != 3)) {
                  local_88 = (octet *)0x0;
                }
                else {
                  uVar5 = decToU32(pcVar10);
                  local_88 = (octet *)(ulong)uVar5;
                  if (0xffffff7e < uVar5 - 0x101 && (uVar5 & 0x3f) == 0) {
                    if (uVar5 != 0x80 || (int)local_80 == 0) {
                      local_88 = (octet *)(ulong)(uVar5 >> 3);
                      goto LAB_0010536a;
                    }
                    local_88 = (octet *)0x10;
                  }
                }
                goto LAB_00105227;
              }
              goto LAB_00105222;
            }
            bVar2 = strStartsWith(pcVar10,"-crc");
            if (bVar2 == 0) {
              iVar4 = strCmp(argv[lVar13],"-pass");
              if (iVar4 == 0) {
                if (local_68 == (octet *)0x0) {
                  argc = argc + -1;
                  eVar3 = cmdPwdRead((cmd_pwd_t *)&local_68,argv[lVar13 + 1]);
                  if (eVar3 == 0) {
                    lVar13 = lVar13 + 2;
                    argc = argc + -1;
                    eVar3 = 0;
                    goto LAB_00105234;
                  }
                  goto LAB_001055a4;
                }
LAB_00105484:
                eVar3 = 0x25c;
              }
              else {
LAB_0010548e:
                eVar3 = 0x25b;
              }
              goto LAB_0010559a;
            }
            if ((int)local_80 != 0) goto LAB_00105484;
            if (local_88 == (octet *)0x10) goto LAB_0010548e;
            lVar13 = lVar13 + 1;
            argc = argc + -1;
            local_80 = (octet *)CONCAT44(local_80._4_4_,1);
          }
          else {
            sVar6 = strLen("-t");
            if (uVar11 == 0) {
              pcVar10 = pcVar10 + sVar6;
              bVar2 = decIsValid(pcVar10);
              eVar9 = 0x25b;
              if (((bVar2 == 0) || (sVar6 = decCLZ(pcVar10), sVar6 != 0)) ||
                 (sVar6 = strLen(pcVar10), 2 < sVar6)) {
                uVar11 = 0;
                goto LAB_00105227;
              }
              uVar5 = decToU32(pcVar10);
              uVar11 = (ulong)uVar5;
              if (uVar5 - 0x11 < 0xfffffff1) goto LAB_00105227;
LAB_0010536a:
              argc = argc + -1;
              lVar13 = lVar13 + 1;
              bVar14 = true;
            }
            else {
LAB_00105222:
              eVar9 = 0x25c;
LAB_00105227:
              eVar3 = eVar9;
              bVar14 = false;
            }
            if (!bVar14) goto LAB_0010559a;
          }
LAB_00105234:
        } while (argc != 0);
        bVar14 = (int)local_80 == 0;
        poVar7 = local_88;
      }
      eVar3 = 0x25b;
      if (local_68 != (octet *)0x0) {
        local_80 = (octet *)CONCAT71(local_80._1_7_,bVar14);
        local_88 = local_68;
        threshold = 2;
        if (uVar11 != 0) {
          threshold = uVar11;
        }
        if ((threshold <= (ulong)(long)argc) &&
           (eVar3 = cmdFileValNotExist(argc,argv + lVar13), ppcVar1 = argv, eVar3 == 0)) {
          local_50 = (size_t)argc;
          *pwd = (cmd_pwd_t)0x0;
          poVar8 = (octet *)0x20;
          if (poVar7 != (octet *)0x0) {
            poVar8 = poVar7;
          }
          poVar7 = poVar8 + 1;
          eVar3 = bpkiShareWrap((octet *)0x0,&local_38,(octet *)0x0,(size_t)poVar7,(octet *)0x0,0,
                                (octet *)0x0,10000);
          if ((eVar3 == 0) && (local_58 = poVar8, eVar3 = cmdRngStart(1), eVar3 == 0)) {
            sVar6 = beltMAC_keep();
            poVar12 = (octet *)((long)poVar7 * local_50);
            local_40 = poVar7;
            sVar6 = utilMax(2,sVar6,poVar12 + local_38 + 8);
            poVar8 = local_58;
            poVar7 = (octet *)blobCreate((size_t)(local_58 + sVar6));
            if (poVar7 == (octet *)0x0) {
              eVar3 = 0x6e;
            }
            else {
              si = poVar7 + (long)poVar8;
              local_70 = poVar7;
              local_60 = poVar12;
              if ((char)local_80 == '\0') {
                poVar12 = poVar8 + -8;
                rngStepR(poVar7,(size_t)poVar12,(void *)0x0);
                beltMACStart(si,local_70,(size_t)poVar12);
                poVar7 = local_70;
                beltMACStepA(local_70,(size_t)poVar12,si);
                beltMACStepG(si + -8,si);
              }
              else {
                rngStepR(poVar7,(size_t)poVar8,(void *)0x0);
              }
              sVar6 = local_50;
              local_80 = si;
              eVar3 = belsShare2(si,local_50,threshold,(size_t)poVar8,poVar7,rngStepR,(void *)0x0);
              if (eVar3 == 0) {
                rngRekey();
                if ((int)sVar6 != 0) {
                  local_48 = local_80 + (long)local_60;
                  poVar8 = local_60 + (long)local_80 + 8;
                  sVar6 = 0;
                  poVar7 = local_80;
                  local_60 = poVar8;
                  do {
                    rngStepR(local_48,8,(void *)0x0);
                    poVar12 = local_88;
                    pwd_len = strLen((char *)local_88);
                    local_80 = poVar7;
                    eVar3 = bpkiShareWrap(poVar8,(size_t *)0x0,poVar7,(size_t)local_40,poVar12,
                                          pwd_len,local_48,10000);
                    if ((eVar3 != 0) ||
                       (eVar3 = cmdFileWrite(ppcVar1[lVar13 + sVar6],poVar8,local_38), eVar3 != 0))
                    goto LAB_00105590;
                    poVar7 = local_80 + (long)local_40;
                    sVar6 = sVar6 + 1;
                  } while (local_50 != sVar6);
                }
                pcVar10 = (char *)blobCreate((long)local_58 * 2 + 1);
                *pwd = pcVar10;
                if (pcVar10 == (char *)0x0) {
                  eVar3 = 0x6e;
                }
                else {
                  hexFrom(pcVar10,local_70,(size_t)local_58);
                  eVar3 = 0;
                }
              }
LAB_00105590:
              blobClose(local_70);
            }
          }
        }
      }
LAB_0010559a:
      blobClose(local_68);
LAB_001055a4:
      cmdArgClose(argv);
      return eVar3;
    }
    pcVar10 = "env:";
  }
  else {
    pcVar10 = "pass:";
  }
  strLen(pcVar10);
  return 0x77;
}

Assistant:

err_t cmdPwdGen(cmd_pwd_t* pwd, const char* cmdline)
{
	if (strStartsWith(cmdline, "pass:"))
		return cmdPwdGenPass(pwd, cmdline + strLen("pass:"));
	else if (strStartsWith(cmdline, "env:"))
		return cmdPwdGenEnv(pwd, cmdline + strLen("env:"));
	else if (strStartsWith(cmdline, "share:"))
		return cmdPwdGenShare(pwd, cmdline + strLen("share:"));
	return ERR_CMD_PARAMS;
}